

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O3

void __thiscall MeCab::Viterbi::Viterbi(Viterbi *this)

{
  this->_vptr_Viterbi = (_func_int **)&PTR__Viterbi_00172dc0;
  (this->tokenizer_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172e80;
  (this->tokenizer_).ptr_ = (Tokenizer<mecab_node_t,_mecab_path_t> *)0x0;
  (this->connector_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172eb0;
  (this->connector_).ptr_ = (Connector *)0x0;
  this->cost_factor_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->what_);
  (this->what_).str_._M_dataplus._M_p = (pointer)&(this->what_).str_.field_2;
  (this->what_).str_._M_string_length = 0;
  (this->what_).str_.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Viterbi::Viterbi()
    :  tokenizer_(0), connector_(0),
       cost_factor_(0) {}